

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

Regexp * re2::Regexp::RemoveLeadingRegexp(Regexp *re)

{
  RegexpOp RVar1;
  int iVar2;
  Regexp **__dest;
  Regexp *in_RDI;
  Regexp *in_stack_00000010;
  ParseFlags pf;
  Regexp *nre;
  Regexp **sub;
  ParseFlags in_stack_ffffffffffffffb8;
  RegexpOp in_stack_ffffffffffffffbc;
  Regexp *local_8;
  
  RVar1 = op(in_RDI);
  local_8 = in_RDI;
  if (RVar1 != kRegexpEmptyMatch) {
    RVar1 = op(in_RDI);
    if ((RVar1 == kRegexpConcat) && (iVar2 = nsub(in_RDI), 1 < iVar2)) {
      __dest = Regexp::sub(in_RDI);
      RVar1 = op(*__dest);
      if (RVar1 != kRegexpEmptyMatch) {
        Decref(in_stack_00000010);
        *__dest = (Regexp *)0x0;
        iVar2 = nsub(in_RDI);
        if (iVar2 == 2) {
          local_8 = __dest[1];
          __dest[1] = (Regexp *)0x0;
          Decref(in_stack_00000010);
        }
        else {
          in_RDI->nsub_ = in_RDI->nsub_ - 1;
          memmove(__dest,__dest + 1,(ulong)in_RDI->nsub_ << 3);
        }
      }
    }
    else {
      parse_flags(in_RDI);
      Decref(in_stack_00000010);
      local_8 = (Regexp *)operator_new(0x28);
      Regexp(local_8,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    }
  }
  return local_8;
}

Assistant:

Regexp* Regexp::RemoveLeadingRegexp(Regexp* re) {
  if (re->op() == kRegexpEmptyMatch)
    return re;
  if (re->op() == kRegexpConcat && re->nsub() >= 2) {
    Regexp** sub = re->sub();
    if (sub[0]->op() == kRegexpEmptyMatch)
      return re;
    sub[0]->Decref();
    sub[0] = NULL;
    if (re->nsub() == 2) {
      // Collapse concatenation to single regexp.
      Regexp* nre = sub[1];
      sub[1] = NULL;
      re->Decref();
      return nre;
    }
    // 3 or more -> 2 or more.
    re->nsub_--;
    memmove(sub, sub + 1, re->nsub_ * sizeof sub[0]);
    return re;
  }
  Regexp::ParseFlags pf = re->parse_flags();
  re->Decref();
  return new Regexp(kRegexpEmptyMatch, pf);
}